

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xunit.h
# Opt level: O0

void __thiscall bandit::reporter::xunit::print_remaining_header_with_time(xunit *this)

{
  ostream *poVar1;
  rep_conflict __val;
  string local_50;
  duration<double,std::ratio<1l,1l>> local_30 [8];
  duration<double,_std::ratio<1L,_1L>_> dur_in_sec;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_20;
  duration<long,_std::ratio<1L,_1000000000L>_> local_18;
  type dur;
  xunit *this_local;
  
  dur.__r = (rep)this;
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_18.__r = (rep)std::chrono::operator-(&local_20,&this->testcase_start_time_point_);
  dur_in_sec.__r =
       (rep_conflict)
       std::chrono::
       duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                 (&local_18);
  std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
            (&this->testsuite_runtime_,(duration<long,_std::ratio<1L,_1000000000L>_> *)&dur_in_sec);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (local_30,&local_18);
  poVar1 = std::operator<<((ostream *)&this->field_0x80," time=\"");
  __val = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)local_30);
  std::__cxx11::to_string(&local_50,__val);
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  std::operator<<(poVar1,"\">\n");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void print_remaining_header_with_time() {
        auto dur = std::chrono::high_resolution_clock::now() - testcase_start_time_point_;
        testsuite_runtime_ += std::chrono::duration_cast<std::chrono::nanoseconds>(dur);
        std::chrono::duration<double> dur_in_sec(dur);
        work_stm_ << " time=\"" << std::to_string(dur_in_sec.count()) << "\">\n";
      }